

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

bool __thiscall
QDirListingPrivate::matchesLegacyFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QRegularExpression *pQVar1;
  long lVar2;
  QRegularExpression *pQVar3;
  bool bVar4;
  bool bVar5;
  const_iterator cVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QStringView fileName;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName(&local_40,entryInfo);
  if (local_40.d.size != 0) {
    fileName.m_data = local_40.d.ptr;
    fileName.m_size = local_40.d.size;
    bVar4 = isDotOrDotDot(fileName);
    uVar7 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
            super_QFlagsStorage<QDir::Filter>.i;
    if (((((!bVar4) || (local_40.d.size != 1)) || ((uVar7 & 0x2000) == 0)) &&
        ((bVar4 & local_40.d.size == 2 & (byte)(uVar7 >> 0xe) & 1) == 0)) &&
       ((((((uVar7 >> 10 & 1) != 0 && (bVar5 = QDirEntryInfo::isDir(entryInfo), bVar5)) ||
          ((lVar2 = (this->nameRegExps).d.size, lVar2 == 0 ||
           (pQVar3 = (this->nameRegExps).d.ptr, pQVar1 = pQVar3 + lVar2,
           cVar6 = std::
                   __find_if<QList<QRegularExpression>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QDirListingPrivate::regexMatchesName(QString_const&)const::_lambda(auto:1_const&)_1_>>
                             (pQVar3,pQVar1,&local_40), cVar6.i != pQVar1)))) &&
         ((((uVar7 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                     super_QFlagsStorage<QDir::Filter>.i, (uVar7 & 8) == 0 ||
            (bVar5 = QDirEntryInfo::isSymLink(entryInfo), !bVar5)) ||
           (((uVar7 >> 9 & 1) != 0 && (bVar5 = QDirEntryInfo::exists(entryInfo), !bVar5)))) &&
          ((bVar4 || ((this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                      super_QFlagsStorage<QDir::Filter>.i & 0x100) != 0 ||
           (bVar4 = QDirEntryInfo::isHidden(entryInfo), !bVar4)))))) &&
        (((uVar7 >> 9 & 1) != 0 ||
         ((((bVar4 = QDirEntryInfo::isFile(entryInfo), bVar4 ||
            (bVar4 = QDirEntryInfo::isDir(entryInfo), bVar4)) ||
           (bVar4 = QDirEntryInfo::isSymLink(entryInfo), bVar4)) &&
          ((bVar4 = QDirEntryInfo::isSymLink(entryInfo), !bVar4 ||
           (bVar4 = QDirEntryInfo::exists(entryInfo), bVar4)))))))))) {
      uVar7 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
              super_QFlagsStorage<QDir::Filter>.i;
      if ((uVar7 & 0x401) == 0) {
        bVar4 = QDirEntryInfo::isDir(entryInfo);
        if (bVar4) goto LAB_0022f9eb;
        uVar7 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                super_QFlagsStorage<QDir::Filter>.i;
      }
      if ((uVar7 & 2) == 0) {
        bVar4 = QDirEntryInfo::isFile(entryInfo);
        if (bVar4) goto LAB_0022f9eb;
        uVar7 = (this->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
                super_QFlagsStorage<QDir::Filter>.i;
      }
      bVar4 = true;
      if ((((uVar7 & 0x70) == 0) || ((uVar7 & 0x70) == 0x70)) ||
         ((((uVar7 & 0x10) == 0 || (bVar5 = QDirEntryInfo::isReadable(entryInfo), bVar5)) &&
          ((((uVar7 & 0x20) == 0 || (bVar5 = QDirEntryInfo::isWritable(entryInfo), bVar5)) &&
           (((uVar7 & 0x40) == 0 || (bVar5 = QDirEntryInfo::isExecutable(entryInfo), bVar5))))))))
      goto LAB_0022f9ed;
    }
  }
LAB_0022f9eb:
  bVar4 = false;
LAB_0022f9ed:
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QDirListingPrivate::matchesLegacyFilters(QDirEntryInfo &entryInfo) const
{
    Q_ASSERT(useLegacyFilters);

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    auto &filters = legacyDirFilters;

    // filter . and ..?
    const bool dotOrDotDot = isDotOrDotDot(fileName);
    const qsizetype fileNameSize = fileName.size();
    if ((filters & QDir::NoDot) && dotOrDotDot && fileNameSize == 1)
        return false;
    if ((filters & QDir::NoDotDot) && dotOrDotDot && fileNameSize == 2)
        return false;

    // name filter
#if QT_CONFIG(regularexpression)
    // Pass all entries through name filters, except dirs if AllDirs is set
    if (!(filters.testAnyFlags(QDir::AllDirs) && entryInfo.isDir())) {
        if (!regexMatchesName(fileName))
            return false;
    }
#endif
    // skip symlinks
    const bool skipSymlinks = filters.testAnyFlag(QDir::NoSymLinks);
    const bool includeSystem = filters.testAnyFlag(QDir::System);
    if (skipSymlinks && entryInfo.isSymLink()) {
        // The only reason to save this file is if it is a broken link and we are requesting system files.
        if (!includeSystem || entryInfo.exists())
            return false;
    }

    // filter hidden
    const bool includeHidden = filters.testAnyFlag(QDir::Hidden);
    if (!includeHidden && !dotOrDotDot && entryInfo.isHidden())
        return false;

    // filter system files
    if (!includeSystem) {
        if (!entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink())
            return false;
        if (entryInfo.isSymLink() && !entryInfo.exists())
            return false;
    }

    // skip directories
    const bool skipDirs = !(filters & (QDir::Dirs | QDir::AllDirs));
    if (skipDirs && entryInfo.isDir())
        return false;

    // skip files
    const bool skipFiles    = !(filters & QDir::Files);
    if (skipFiles && entryInfo.isFile())
        // Basically we need a reason not to exclude this file otherwise we just eliminate it.
        return false;

    // filter permissions
    const auto perms = filters & QDir::PermissionMask;
    const bool filterPermissions = perms != 0 && perms != QDir::PermissionMask;
    if (filterPermissions) {
        const bool doWritable = filters.testAnyFlags(QDir::Writable);
        const bool doExecutable = filters.testAnyFlags(QDir::Executable);
        const bool doReadable = filters.testAnyFlags(QDir::Readable);
        if ((doReadable && !entryInfo.isReadable())
            || (doWritable && !entryInfo.isWritable())
            || (doExecutable && !entryInfo.isExecutable())) {
            return false;
        }
    }

    return true;
}